

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DoubleParameter::DoubleParameter(DoubleParameter *this,DoubleParameter *from)

{
  void *pvVar1;
  DoubleRange *this_00;
  DoubleRange *from_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DoubleParameter_0072b790;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->defaultvalue_ = from->defaultvalue_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    this->_oneof_case_[0] = 10;
    this_00 = (DoubleRange *)operator_new(0x28);
    DoubleRange::DoubleRange(this_00);
    (this->AllowedValues_).range_ = this_00;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (from->AllowedValues_).range_;
    }
    else {
      from_00 = DoubleRange::default_instance();
    }
    DoubleRange::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

DoubleParameter::DoubleParameter(const DoubleParameter& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  defaultvalue_ = from.defaultvalue_;
  clear_has_AllowedValues();
  switch (from.AllowedValues_case()) {
    case kRange: {
      mutable_range()->::CoreML::Specification::DoubleRange::MergeFrom(from.range());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DoubleParameter)
}